

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O2

void __thiscall
amrex::EB2::SplineIF::addSplineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  SplineDistFcnElement2d *this_00;
  SplineDistFcnElement2d *local_40;
  _Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_> local_38;
  
  this_00 = (SplineDistFcnElement2d *)operator_new(0x98);
  (this_00->super_distFcnElement2d)._vptr_distFcnElement2d =
       (_func_int **)&PTR_newDistFcnElement2d_007d5050;
  memset(&this_00->control_points_x,0,0x90);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector
            ((vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *)&local_38,pts);
  SplineDistFcnElement2d::set_control_points
            (this_00,(vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *)&local_38);
  std::_Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>::~_Vector_base(&local_38);
  SplineDistFcnElement2d::calc_D(this_00,false);
  local_40 = this_00;
  std::vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>>::
  emplace_back<amrex::distFcnElement2d*>
            ((vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>> *)this,
             (distFcnElement2d **)&local_40);
  return;
}

Assistant:

void addSplineElement(std::vector<amrex::RealVect> pts) {
    SplineDistFcnElement2d * theSpline = new SplineDistFcnElement2d();
    theSpline->set_control_points(pts);
    theSpline->calc_D();
    geomElements.push_back(theSpline);
  }